

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

int reportProcessingInstruction(XML_Parser parser,ENCODING *enc,char *start,char *end)

{
  STRING_POOL *pool;
  int iVar1;
  XML_Char *pXVar2;
  char *pcVar3;
  XML_Char *s;
  int iVar4;
  
  if (*(long *)((long)parser + 0x80) == 0) {
    iVar4 = 1;
    if (*(long *)((long)parser + 0xa0) != 0) {
      reportDefault(parser,enc,start,end);
    }
  }
  else {
    pcVar3 = start + (long)enc->minBytesPerChar * 2;
    iVar1 = (*enc->nameLength)(enc,pcVar3);
    pool = (STRING_POOL *)((long)parser + 0x418);
    pXVar2 = poolStoreString(pool,enc,pcVar3,pcVar3 + iVar1);
    iVar4 = 0;
    if (pXVar2 != (XML_Char *)0x0) {
      *(undefined8 *)((long)parser + 0x438) = *(undefined8 *)((long)parser + 0x430);
      pcVar3 = (*enc->skipS)(enc,pcVar3 + iVar1);
      s = poolStoreString(pool,enc,pcVar3,end + (long)enc->minBytesPerChar * -2);
      if (s != (XML_Char *)0x0) {
        normalizeLines(s);
        (**(code **)((long)parser + 0x80))(*(undefined8 *)((long)parser + 8),pXVar2,s);
        poolClear(pool);
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

static int
reportProcessingInstruction(XML_Parser parser, const ENCODING *enc, const char *start, const char *end)
{
  const XML_Char *target;
  XML_Char *data;
  const char *tem;
  if (!processingInstructionHandler) {
    if (defaultHandler)
      reportDefault(parser, enc, start, end);
    return 1;
  }
  start += enc->minBytesPerChar * 2;
  tem = start + XmlNameLength(enc, start);
  target = poolStoreString(&tempPool, enc, start, tem);
  if (!target)
    return 0;
  poolFinish(&tempPool);
  data = poolStoreString(&tempPool, enc,
                        XmlSkipS(enc, tem),
                        end - enc->minBytesPerChar*2);
  if (!data)
    return 0;
  normalizeLines(data);
  processingInstructionHandler(handlerArg, target, data);
  poolClear(&tempPool);
  return 1;
}